

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int updateMapping(Rtree *pRtree,i64 iRowid,RtreeNode *pNode,int iHeight)

{
  int iVar1;
  RtreeNode *pRVar2;
  RtreeNode *pRVar3;
  code *UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = parentWrite;
  if (iHeight == 0) {
    UNRECOVERED_JUMPTABLE = rowidWrite;
  }
  if (0 < iHeight) {
    pRVar2 = nodeHashLookup(pRtree,iRowid);
    for (pRVar3 = pNode; pRVar3 != (RtreeNode *)0x0; pRVar3 = pRVar3->pParent) {
      if (pRVar3 == pRVar2) {
        return 0x10b;
      }
    }
    if (pRVar2 != (RtreeNode *)0x0) {
      nodeRelease(pRtree,pRVar2->pParent);
      if (pNode != (RtreeNode *)0x0) {
        pNode->nRef = pNode->nRef + 1;
      }
      pRVar2->pParent = pNode;
    }
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)(pRtree,iRowid,pNode->iNode);
  return iVar1;
}

Assistant:

static int updateMapping(
  Rtree *pRtree,
  i64 iRowid,
  RtreeNode *pNode,
  int iHeight
){
  int (*xSetMapping)(Rtree *, sqlite3_int64, sqlite3_int64);
  xSetMapping = ((iHeight==0)?rowidWrite:parentWrite);
  if( iHeight>0 ){
    RtreeNode *pChild = nodeHashLookup(pRtree, iRowid);
    RtreeNode *p;
    for(p=pNode; p; p=p->pParent){
      if( p==pChild ) return SQLITE_CORRUPT_VTAB;
    }
    if( pChild ){
      nodeRelease(pRtree, pChild->pParent);
      nodeReference(pNode);
      pChild->pParent = pNode;
    }
  }
  if( NEVER(pNode==0) ) return SQLITE_ERROR;
  return xSetMapping(pRtree, iRowid, pNode->iNode);
}